

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Cord __thiscall
absl::lts_20250127::Cord::ChunkIterator::AdvanceAndReadBytes(ChunkIterator *this,size_t n)

{
  byte bVar1;
  ulong uVar2;
  void *__src;
  RefcountAndFlags *pRVar3;
  Nullable<CordRep_*> node;
  long lVar4;
  uint8_t *puVar5;
  ulong in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar6;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  ChunkIterator *unaff_RBX;
  Nullable<CordRep_*> pCVar7;
  ChunkIterator *__dest;
  ulong uVar8;
  ChunkIterator *__dest_00;
  size_t sVar9;
  size_type __rlen;
  long *in_FS_OFFSET;
  string_view sVar10;
  Cord CVar11;
  CordRep *rep;
  anon_union_16_2_39e9c77e_for_Rep_0 local_48;
  
  __dest = this;
  if (*(ulong *)(n + 0x18) < in_RDX) {
LAB_004aab9a:
    AdvanceAndReadBytes();
    this = unaff_RBX;
LAB_004aab9f:
    AdvanceAndReadBytes();
LAB_004aaba4:
    lVar4 = cord_internal::cordz_should_profile_slow
                      ((SamplingState *)
                       ((__dest->btree_reader_).navigator_.index_ + *in_FS_OFFSET + -0x2c));
    pcVar6 = extraout_RDX_05;
LAB_004aa973:
    if (0 < lVar4) {
      cord_internal::CordzInfo::TrackCord((InlineData *)this,kCordReader,lVar4);
      pcVar6 = extraout_RDX_02;
    }
  }
  else {
    (this->current_chunk_)._M_len = 0;
    (this->current_chunk_)._M_str = (char *)0x0;
    if (in_RDX < 0x10) {
      (this->current_chunk_)._M_len = 0;
      (this->current_chunk_)._M_str = (char *)0x0;
      *(char *)&(this->current_chunk_)._M_len = (char)in_RDX * '\x02';
      __dest = (ChunkIterator *)((long)&(this->current_chunk_)._M_len + 1);
      uVar8 = *(ulong *)n;
      if (uVar8 < in_RDX) {
        __dest_00 = __dest;
        do {
          __dest = __dest_00;
          memcpy(__dest_00,*(void **)(n + 8),uVar8);
          uVar2 = *(ulong *)(n + 0x18);
          if (uVar2 == 0) {
            AdvanceAndReadBytes();
            unaff_RBX = this;
            goto LAB_004aab9a;
          }
          __dest = (ChunkIterator *)((__dest_00->btree_reader_).navigator_.index_ + (uVar8 - 0x2c));
          in_RDX = in_RDX - uVar8;
          if (uVar2 < uVar8) goto LAB_004aabec;
          *(ulong *)(n + 0x18) = uVar2 - uVar8;
          if (uVar2 - uVar8 != 0) {
            if (((long)*(int *)(n + 0x28) < 0) ||
               (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) == 0)) {
              if (uVar8 == 0) goto LAB_004aac0b;
              *(undefined8 *)n = 0;
              *(undefined8 *)(n + 8) = 0;
            }
            else {
              sVar10 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
              *(string_view *)n = sVar10;
            }
          }
          uVar8 = *(ulong *)n;
          __dest_00 = __dest;
        } while (uVar8 < in_RDX);
      }
      __src = *(void **)(n + 8);
      memcpy(__dest,__src,in_RDX);
      pcVar6 = extraout_RDX;
      if (uVar8 < in_RDX || uVar8 - in_RDX == 0) {
        if (in_RDX == 0) goto LAB_004aab83;
        uVar2 = *(ulong *)(n + 0x18);
        if (uVar2 != 0) {
          if (uVar2 < uVar8) {
LAB_004aabec:
            __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          *(ulong *)(n + 0x18) = uVar2 - uVar8;
          if (uVar2 - uVar8 != 0) {
            if (((long)*(int *)(n + 0x28) < 0) ||
               (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) == 0)) {
              if (uVar8 == 0) {
LAB_004aac0b:
                __assert_fail("!current_chunk_.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                              ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()")
                ;
              }
              *(undefined8 *)n = 0;
              *(undefined8 *)(n + 8) = 0;
            }
            else {
              sVar10 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
              pcVar6 = sVar10._M_str;
              *(string_view *)n = sVar10;
            }
          }
          goto LAB_004aab83;
        }
        goto LAB_004aab9f;
      }
      *(ulong *)(n + 8) = (long)__src + in_RDX;
      *(ulong *)n = uVar8 - in_RDX;
    }
    else {
      if (((long)*(int *)(n + 0x28) < 0) ||
         (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) == 0)) {
        pCVar7 = *(Nullable<CordRep_*> *)(n + 0x10);
        if (pCVar7 == (Nullable<CordRep_*>)0x0) {
          __assert_fail("current_leaf_ != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.cc"
                        ,0x46a,"Cord absl::Cord::ChunkIterator::AdvanceAndReadBytes(size_t)");
        }
        if (pCVar7->length != in_RDX) {
          pRVar3 = (RefcountAndFlags *)(n + 0x10);
          if (pCVar7->tag == '\x01') {
            pRVar3 = &pCVar7[1].refcount;
          }
          pCVar7 = *(Nullable<CordRep_*> *)pRVar3;
          bVar1 = pCVar7->tag;
          if (bVar1 == 5) {
            puVar5 = (uint8_t *)pCVar7[1].length;
          }
          else {
            if ((bVar1 - 0xf9 < 7) || (bVar1 < 5)) {
              __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                            ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
            }
            puVar5 = pCVar7->storage;
          }
          if (pCVar7 == (Nullable<CordRep_*>)0x0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x1a3,
                          "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                         );
          }
          sVar9 = *(long *)(n + 8) - (long)puVar5;
          uVar8 = pCVar7->length;
          if (uVar8 <= sVar9) {
            __assert_fail("pos < rep->length",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x1a5,
                          "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                         );
          }
          if (uVar8 - sVar9 < in_RDX) {
            __assert_fail("n <= rep->length - pos",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x1a6,
                          "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                         );
          }
          if (uVar8 == in_RDX) {
            LOCK();
            (pCVar7->refcount).count_.super___atomic_base<int>._M_i =
                 (pCVar7->refcount).count_.super___atomic_base<int>._M_i + 2;
            UNLOCK();
            node = pCVar7;
          }
          else {
            if (bVar1 == 1) {
              sVar9 = sVar9 + pCVar7[1].length;
              pCVar7 = *(Nullable<CordRep_*> *)&pCVar7[1].refcount;
            }
            node = (Nullable<CordRep_*>)operator_new(0x20);
            node->length = 0;
            node->refcount = (atomic<int>)0x0;
            node->tag = '\0';
            node->storage[0] = '\0';
            node->storage[1] = '\0';
            node->storage[2] = '\0';
            node[1].length = 0;
            node[1].refcount = (atomic<int>)0x0;
            node[1].tag = '\0';
            node[1].storage[0] = '\0';
            node[1].storage[1] = '\0';
            node[1].storage[2] = '\0';
            (node->refcount).count_.super___atomic_base<int>._M_i = 2;
            node->length = in_RDX;
            node->tag = '\x01';
            node[1].length = sVar9;
            if (pCVar7 == (Nullable<CordRep_*>)0x0) {
              __assert_fail("rep != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
            }
            LOCK();
            (pCVar7->refcount).count_.super___atomic_base<int>._M_i =
                 (pCVar7->refcount).count_.super___atomic_base<int>._M_i + 2;
            UNLOCK();
            *(Nullable<CordRep_*> *)&node[1].refcount = pCVar7;
          }
          VerifyTree(node);
          (this->current_chunk_)._M_str = (char *)node;
          (this->current_chunk_)._M_len = 1;
          if (in_FS_OFFSET[-0xb] < 2) {
            lVar4 = cord_internal::cordz_should_profile_slow
                              ((SamplingState *)(*in_FS_OFFSET + -0x58));
            pcVar6 = extraout_RDX_06;
          }
          else {
            in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
            lVar4 = 0;
            pcVar6 = extraout_RDX_04;
          }
          if (0 < lVar4) {
            cord_internal::CordzInfo::TrackCord((InlineData *)this,kCordReader,lVar4);
            pcVar6 = extraout_RDX_07;
          }
          *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
          *(long *)(n + 8) = *(long *)(n + 8) + in_RDX;
          *(ulong *)n = *(long *)n - in_RDX;
          goto LAB_004aab83;
        }
        *(undefined8 *)(n + 0x18) = 0;
        *(undefined8 *)n = 0;
        *(undefined8 *)(n + 8) = 0;
        LOCK();
        (pCVar7->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar7->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        VerifyTree(pCVar7);
        (this->current_chunk_)._M_str = (char *)pCVar7;
        (this->current_chunk_)._M_len = 1;
        __dest = (ChunkIterator *)0xffffffffffffffa8;
        if (in_FS_OFFSET[-0xb] < 2) goto LAB_004aaba4;
        in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
        lVar4 = 0;
        pcVar6 = extraout_RDX_01;
        goto LAB_004aa973;
      }
      uVar8 = *(ulong *)n;
      if (in_RDX < 0x200 && in_RDX <= uVar8) {
        sVar10._M_str = *(char **)(n + 8);
        sVar10._M_len = in_RDX;
        Cord((Cord *)&local_48.as_tree,sVar10,kCordReader);
        if (((this->current_chunk_)._M_len & 1) != 0) {
          InlineRep::UnrefTree((InlineRep *)this);
        }
        (this->current_chunk_)._M_len = local_48.as_tree.cordz_info;
        (this->current_chunk_)._M_str = (char *)local_48.as_tree.rep;
        local_48.as_tree.cordz_info = 0;
        local_48.as_tree.rep = (CordRep *)0x0;
        ~Cord((Cord *)&local_48.as_tree);
        if (in_RDX < uVar8) {
          *(long *)(n + 8) = *(long *)(n + 8) + in_RDX;
          *(ulong *)n = *(long *)n - in_RDX;
          pcVar6 = extraout_RDX_00;
        }
        else {
          sVar10 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
          pcVar6 = sVar10._M_str;
          *(string_view *)n = sVar10;
        }
      }
      else {
        sVar10 = cord_internal::CordRepBtreeReader::Read
                           ((CordRepBtreeReader *)(n + 0x20),in_RDX,uVar8,(CordRep **)&local_48);
        pcVar6 = sVar10._M_str;
        *(string_view *)n = sVar10;
        if ((char *)local_48.as_tree.cordz_info == (char *)0x0) {
          __assert_fail("rep",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                        ,0x4e8,
                        "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                       );
        }
        (this->current_chunk_)._M_str = (char *)local_48.as_tree.cordz_info;
        (this->current_chunk_)._M_len = 1;
        if (in_FS_OFFSET[-0xb] < 2) {
          lVar4 = cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58))
          ;
          pcVar6 = extraout_RDX_08;
        }
        else {
          in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
          lVar4 = 0;
        }
        if (0 < lVar4) {
          cord_internal::CordzInfo::TrackCord((InlineData *)this,kCordReader,lVar4);
          pcVar6 = extraout_RDX_03;
        }
      }
    }
    *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
  }
LAB_004aab83:
  CVar11.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)pcVar6;
  CVar11.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar11.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::ChunkIterator::AdvanceAndReadBytes(size_t n) {
  ABSL_HARDENING_ASSERT(bytes_remaining_ >= n &&
                        "Attempted to iterate past `end()`");
  Cord subcord;
  auto constexpr method = CordzUpdateTracker::kCordReader;

  if (n <= InlineRep::kMaxInline) {
    // Range to read fits in inline data. Flatten it.
    char* data = subcord.contents_.set_data(n);
    while (n > current_chunk_.size()) {
      memcpy(data, current_chunk_.data(), current_chunk_.size());
      data += current_chunk_.size();
      n -= current_chunk_.size();
      ++*this;
    }
    memcpy(data, current_chunk_.data(), n);
    if (n < current_chunk_.size()) {
      RemoveChunkPrefix(n);
    } else if (n > 0) {
      ++*this;
    }
    return subcord;
  }

  if (btree_reader_) {
    size_t chunk_size = current_chunk_.size();
    if (n <= chunk_size && n <= kMaxBytesToCopy) {
      subcord = Cord(current_chunk_.substr(0, n), method);
      if (n < chunk_size) {
        current_chunk_.remove_prefix(n);
      } else {
        current_chunk_ = btree_reader_.Next();
      }
    } else {
      CordRep* rep;
      current_chunk_ = btree_reader_.Read(n, chunk_size, rep);
      subcord.contents_.EmplaceTree(rep, method);
    }
    bytes_remaining_ -= n;
    return subcord;
  }

  // Short circuit if reading the entire data edge.
  assert(current_leaf_ != nullptr);
  if (n == current_leaf_->length) {
    bytes_remaining_ = 0;
    current_chunk_ = {};
    CordRep* tree = CordRep::Ref(current_leaf_);
    subcord.contents_.EmplaceTree(VerifyTree(tree), method);
    return subcord;
  }

  // From this point on, we need a partial substring node.
  // Get pointer to the underlying flat or external data payload and
  // compute data pointer and offset into current flat or external.
  CordRep* payload = current_leaf_->IsSubstring()
                         ? current_leaf_->substring()->child
                         : current_leaf_;
  const char* data = payload->IsExternal() ? payload->external()->base
                                           : payload->flat()->Data();
  const size_t offset = static_cast<size_t>(current_chunk_.data() - data);

  auto* tree = CordRepSubstring::Substring(payload, offset, n);
  subcord.contents_.EmplaceTree(VerifyTree(tree), method);
  bytes_remaining_ -= n;
  current_chunk_.remove_prefix(n);
  return subcord;
}